

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O2

void CDIVID(double *AR,double *AI,double *BR,double *BI,double INFINY,double *CR,double *CI)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *BR;
  dVar1 = *BI;
  if ((((dVar2 == 0.0) && (!NAN(dVar2))) && (dVar1 == 0.0)) && (!NAN(dVar1))) {
    *CI = INFINY;
    *CR = INFINY;
    return;
  }
  if (ABS(dVar1) <= ABS(dVar2)) {
    dVar3 = dVar1 / dVar2;
    dVar2 = dVar1 * dVar3 + dVar2;
    *CR = (*AI * dVar3 + *AR) / dVar2;
    *CI = (*AI - dVar3 * *AR) / dVar2;
  }
  else {
    dVar3 = dVar2 / dVar1;
    dVar1 = dVar2 * dVar3 + dVar1;
    *CR = (*AR * dVar3 + *AI) / dVar1;
    *CI = (dVar3 * *AI - *AR) / dVar1;
  }
  return;
}

Assistant:

static void CDIVID(double *AR, double *AI, double *BR, double *BI, double INFINY, double *CR, double *CI) {
	// C COMPLEX DIVISION C = A/B, AVOIDING OVERFLOW.
	double INFIN,R,D;
	if ( !(*BR != 0.0 || *BI != 0.0) ) {
		INFIN = INFINY;
		*CR = *CI = INFIN;
	}
	else {
		if (fabs(*BR) < fabs(*BI)) {
			R = *BR / *BI;
			D = *BI + R * *BR;
			*CR = (*AR*R + *AI) / D;
			*CI = (*AI*R - *AR) / D;
		}
		else {
			R = *BI / *BR;
			D = *BR + R * *BI;
			*CR = (*AR + *AI*R) / D;
			*CI = (*AI - *AR*R) / D;
		}
	}

}